

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::AccuracyParameter::Clear(AccuracyParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    this->ignore_label_ = 0;
    this->top_k_ = 1;
    this->axis_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void AccuracyParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.AccuracyParameter)
  if (_has_bits_[0 / 32] & 7u) {
    ignore_label_ = 0;
    top_k_ = 1u;
    axis_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}